

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void BenchTopKSubset<4u>(string *PATH)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  void *pvVar5;
  ofstream *poVar6;
  reference ppbVar7;
  iterator this;
  reference ppbVar8;
  double dVar9;
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  int j_1;
  int j;
  int l_1;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  int i_2;
  uint32_t i_1;
  basic_ostream<char,_std::char_traits<char>_> **out;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  int memory;
  int i;
  Abstract<4U> *sketches [5] [5];
  uint32_t topK;
  int l;
  HashMap<4U> mp;
  int nshrink;
  int heap_size;
  int32_t batch_size;
  int32_t epoch_num;
  int32_t cmp_num;
  int32_t mem_var;
  int32_t mem_inc;
  int32_t mem_base;
  string file;
  Data<4U> *items;
  count_type cnt;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  allocator_type *in_stack_fffffffffffffaf0;
  size_type in_stack_fffffffffffffaf8;
  LdSketchWrapper<4U> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  Count_Heap<4U> *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  WavingSketch<8U,_1U,_4U> *in_stack_fffffffffffffb20;
  int *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_430;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_428;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_stack_fffffffffffffc10;
  int batch_size_00;
  int in_stack_fffffffffffffc20;
  HashMap<4U> *in_stack_fffffffffffffc28;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_3c8;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_3c0;
  int local_3b8;
  uint local_3b4;
  reference local_3b0;
  basic_ostream<char,_std::char_traits<char>_> **local_3a8;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_3a0;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_398;
  undefined1 local_389;
  string local_388 [32];
  string local_368 [32];
  string local_348 [39];
  undefined1 local_321;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [39];
  undefined1 local_2b9;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [39];
  undefined1 local_251;
  string local_250 [32];
  string local_230 [32];
  string local_210 [40];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_1e8;
  int local_1d0;
  int local_1cc;
  long local_1c8 [32];
  int local_c4;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_c0;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_b8;
  int local_ac;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  allocator local_39;
  string local_38 [32];
  Data<4U> *local_18;
  int local_c;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchTopKSubset\n\x1b[0m");
  local_c = 0;
  local_18 = (Data<4U> *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"caida",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::c_str();
  local_18 = read_standard_data<4u>(in_stack_fffffffffffffba0,iVar2,in_stack_fffffffffffffb90);
  poVar3 = std::operator<<((ostream *)&std::cout,"Total ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  poVar3 = std::operator<<(poVar3," items");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_50 = 0;
  local_54 = 50000;
  local_58 = 5;
  local_5c = 5;
  local_60 = 100;
  local_64 = 1000;
  local_68 = 0x9c4;
  local_6c = 0;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x10d9bd);
  for (local_ac = 0; local_ac < local_c; local_ac = local_ac + 1) {
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::find(in_stack_fffffffffffffad8,(key_type *)0x10d9fd);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_fffffffffffffad8);
    bVar1 = std::__detail::operator==(&local_b8,&local_c0);
    if (bVar1) {
      pmVar4 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
      *pmVar4 = 1;
    }
    else {
      pmVar4 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
      *pmVar4 = *pmVar4 + 1;
    }
  }
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  iVar2 = Get_TopK<4u>((HashMap<4U> *)in_stack_fffffffffffffb20,
                       (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x10db71);
  local_c4 = iVar2;
  for (local_1cc = 0; local_1cc < 5; local_1cc = local_1cc + 1) {
    local_1d0 = local_50 + local_54 * (local_1cc + 1);
    pvVar5 = operator_new(0xa8);
    WavingSketch<8U,_1U,_4U>::WavingSketch
              (in_stack_fffffffffffffb20,(uint32_t)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    local_1c8[(long)local_1cc * 5] = (long)pvVar5;
    pvVar5 = operator_new(0x78);
    SS<4U>::SS((SS<4U> *)in_stack_fffffffffffffb00,(uint32_t)(in_stack_fffffffffffffaf8 >> 0x20));
    local_1c8[(long)local_1cc * 5 + 1] = (long)pvVar5;
    pvVar5 = operator_new(0x78);
    USS<4U>::USS((USS<4U> *)in_stack_fffffffffffffb00,(uint32_t)(in_stack_fffffffffffffaf8 >> 0x20))
    ;
    local_1c8[(long)local_1cc * 5 + 2] = (long)pvVar5;
    pvVar5 = operator_new(0x88);
    Count_Heap<4U>::Count_Heap
              (in_stack_fffffffffffffb10,(uint32_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
               (uint32_t)in_stack_fffffffffffffb08,
               (uint32_t)((ulong)in_stack_fffffffffffffb00 >> 0x20));
    local_1c8[(long)local_1cc * 5 + 3] = (long)pvVar5;
    pvVar5 = operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper
              (in_stack_fffffffffffffb00,(uint32_t)(in_stack_fffffffffffffaf8 >> 0x20),
               (int)in_stack_fffffffffffffaf8);
    local_1c8[(long)local_1cc * 5 + 4] = (long)pvVar5;
  }
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10dea5);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10decb);
  poVar6 = (ofstream *)operator_new(0x200);
  local_251 = 1;
  std::operator+(in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::operator+(in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
  std::ofstream::ofstream(poVar6,local_210,0x10);
  local_251 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_1e8,0);
  *ppbVar7 = (value_type)poVar6;
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  poVar6 = (ofstream *)operator_new(0x200);
  local_2b9 = 1;
  std::operator+(in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::operator+(in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
  std::ofstream::ofstream(poVar6,local_278,0x10);
  local_2b9 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_1e8,1);
  *ppbVar7 = (value_type)poVar6;
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  poVar6 = (ofstream *)operator_new(0x200);
  local_321 = 1;
  std::operator+(in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::operator+(in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
  std::ofstream::ofstream(poVar6,local_2e0,0x10);
  local_321 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_1e8,2);
  *ppbVar7 = (value_type)poVar6;
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_320);
  poVar6 = (ofstream *)operator_new(0x200);
  local_389 = 1;
  std::operator+(in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::operator+(in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
  std::ofstream::ofstream(poVar6,local_348,0x10);
  local_389 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_1e8,3);
  *ppbVar7 = (value_type)poVar6;
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_388);
  local_398 = &local_1e8;
  local_3a0._M_current =
       (basic_ostream<char,_std::char_traits<char>_> **)
       std::
       vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)in_stack_fffffffffffffad8);
  local_3a8 = (basic_ostream<char,_std::char_traits<char>_> **)
              std::
              vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     *)in_stack_fffffffffffffad8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_fffffffffffffae0,
                       (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_fffffffffffffad8);
    if (!bVar1) break;
    local_3b0 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&local_3a0);
    poVar3 = std::operator<<((ostream *)*local_3b0,"MEM(KB)");
    std::operator<<(poVar3,",");
    for (local_3b4 = 0; local_3b4 < 5; local_3b4 = local_3b4 + 1) {
      poVar3 = std::operator<<((ostream *)*local_3b0,(string *)(local_1c8[local_3b4] + 8));
      std::operator<<(poVar3,",");
    }
    std::ostream::operator<<((ostream *)*local_3b0,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&local_3a0);
  }
  for (local_3b8 = 0; local_3b8 < 5; local_3b8 = local_3b8 + 1) {
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",
           (ulong)(uint)((local_50 + local_54 * (local_3b8 + 1)) / 1000));
    local_3c0 = &local_1e8;
    local_3c8._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffffad8);
    this = std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffffad8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffae0,
                         (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffad8);
      if (!bVar1) break;
      in_stack_fffffffffffffc28 =
           (HashMap<4U> *)
           __gnu_cxx::
           __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
           ::operator*(&local_3c8);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)(in_stack_fffffffffffffc28->_M_h)._M_buckets,
                          (local_50 + local_54 * (local_3b8 + 1)) / 1000);
      std::operator<<(poVar3,",");
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_3c8);
    }
    dVar9 = LdSketchWrapper<4U>::average_l
                      ((LdSketchWrapper<4U> *)local_1c8[(long)local_3b8 * 5 + 4]);
    printf("Init average l: %lf\n",dVar9);
    for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
      for (in_stack_fffffffffffffc20 = 0; in_stack_fffffffffffffc20 < 5;
          in_stack_fffffffffffffc20 = in_stack_fffffffffffffc20 + 1) {
        (*(code *)**(undefined8 **)local_1c8[(long)local_3b8 * 5 + (long)in_stack_fffffffffffffc20])
                  ((undefined8 *)local_1c8[(long)local_3b8 * 5 + (long)in_stack_fffffffffffffc20],
                   local_18 + iVar2);
      }
    }
    dVar9 = LdSketchWrapper<4U>::average_l
                      ((LdSketchWrapper<4U> *)local_1c8[(long)local_3b8 * 5 + 4]);
    printf("After average l: %lf\n",dVar9);
    for (batch_size_00 = 0; batch_size_00 < 5; batch_size_00 = batch_size_00 + 1) {
      in_stack_fffffffffffffaf0 =
           (allocator_type *)local_1c8[(long)local_3b8 * 5 + (long)batch_size_00];
      std::
      unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
      ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                       *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      Abstract<4U>::CheckSubset
                ((Abstract<4U> *)this._M_current,in_stack_fffffffffffffc28,iVar2,
                 in_stack_fffffffffffffc20,batch_size_00,in_stack_fffffffffffffc10);
      std::
      unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
      ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                        *)0x10e8e0);
      if ((long *)local_1c8[(long)local_3b8 * 5 + (long)batch_size_00] != (long *)0x0) {
        (**(code **)(*(long *)local_1c8[(long)local_3b8 * 5 + (long)batch_size_00] + 0x48))();
      }
    }
    local_428 = &local_1e8;
    local_430._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffffad8);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)in_stack_fffffffffffffad8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffae0,
                         (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffad8);
      if (!bVar1) break;
      ppbVar8 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&local_430);
      std::ostream::operator<<((ostream *)*ppbVar8,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_430);
    }
  }
  if (local_18 != (Data<4U> *)0x0) {
    operator_delete(local_18,4);
  }
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)in_stack_fffffffffffffaf0);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x10ea3f);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BenchTopKSubset(std::string PATH)
{
	printf("\033[0m\033[1;4;33m# Testing function: BenchTopKSubset\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 5;
	constexpr int32_t cmp_num = 5;
	constexpr int32_t epoch_num = 100;
	constexpr int32_t batch_size = 1000;
	int heap_size = 2500;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK<DATA_LEN>(mp, 2000);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new SS<DATA_LEN>(memory / 100);
		sketches[i][2] = new USS<DATA_LEN>(memory / 100);
		sketches[i][3] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][4] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE.csv"); // subset sum
	outs[1] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE1.csv"); //subset average
	outs[3] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE1.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->CheckSubset(mp, topK, epoch_num, batch_size, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}